

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryEmitGeometryShaderTests.cpp
# Opt level: O2

string * __thiscall
vkt::geometry::(anonymous_namespace)::EmitTest::shaderGeometry_abi_cxx11_
          (string *__return_storage_ptr__,void *this,bool pointSize)

{
  ostream *poVar1;
  VkPrimitiveTopology *outputType;
  int i_3;
  int i_1;
  int i;
  int iVar2;
  ostringstream src;
  string local_1c8;
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  poVar1 = std::operator<<((ostream *)local_1a8,"#version 310 es\n");
  std::operator<<(poVar1,"#extension GL_EXT_geometry_shader : require\n");
  if (pointSize) {
    std::operator<<((ostream *)local_1a8,"#extension GL_EXT_geometry_point_size : require\n");
  }
  poVar1 = std::operator<<((ostream *)local_1a8,"layout(points) in;\n");
  poVar1 = std::operator<<(poVar1,"layout(");
  outputTypeToGLString_abi_cxx11_(&local_1c8,(geometry *)((long)this + 0x70),outputType);
  poVar1 = std::operator<<(poVar1,(string *)&local_1c8);
  poVar1 = std::operator<<(poVar1,", max_vertices = ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,*(int *)((long)this + 0x74) + *(int *)((long)this + 0x7c) + 1);
  poVar1 = std::operator<<(poVar1,") out;\n");
  poVar1 = std::operator<<(poVar1,"layout(location = 0) in highp vec4 v_geom_FragColor[];\n");
  poVar1 = std::operator<<(poVar1,"layout(location = 0) out highp vec4 v_frag_FragColor;\n");
  poVar1 = std::operator<<(poVar1,"void main (void)\n");
  poVar1 = std::operator<<(poVar1,"{\n");
  poVar1 = std::operator<<(poVar1,"\tconst highp vec4 position0 = vec4(-0.5,  0.5, 0.0, 0.0);\n");
  poVar1 = std::operator<<(poVar1,"\tconst highp vec4 position1 = vec4( 0.0,  0.1, 0.0, 0.0);\n");
  poVar1 = std::operator<<(poVar1,"\tconst highp vec4 position2 = vec4( 0.5,  0.5, 0.0, 0.0);\n");
  poVar1 = std::operator<<(poVar1,"\tconst highp vec4 position3 = vec4( 0.7, -0.2, 0.0, 0.0);\n");
  poVar1 = std::operator<<(poVar1,"\tconst highp vec4 position4 = vec4( 0.2,  0.2, 0.0, 0.0);\n");
  std::operator<<(poVar1,"\tconst highp vec4 position5 = vec4( 0.4, -0.3, 0.0, 0.0);\n");
  std::__cxx11::string::~string((string *)&local_1c8);
  for (iVar2 = 0; iVar2 < *(int *)((long)this + 0x74); iVar2 = iVar2 + 1) {
    if (pointSize) {
      std::operator<<((ostream *)local_1a8,"\tgl_PointSize = 1.0;\n");
    }
    poVar1 = std::operator<<((ostream *)local_1a8,"\tgl_Position = gl_in[0].gl_Position + position")
    ;
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar2);
    std::operator<<(poVar1,
                    ";\n\tgl_PrimitiveID = gl_PrimitiveIDIn;\n\tv_frag_FragColor = v_geom_FragColor[0];\n\tEmitVertex();\n\n"
                   );
  }
  for (iVar2 = 0; iVar2 < *(int *)((long)this + 0x78); iVar2 = iVar2 + 1) {
    std::operator<<((ostream *)local_1a8,"\tEndPrimitive();\n");
  }
  for (iVar2 = 0; iVar2 < *(int *)((long)this + 0x7c); iVar2 = iVar2 + 1) {
    if (pointSize) {
      std::operator<<((ostream *)local_1a8,"\tgl_PointSize = 1.0;\n");
    }
    poVar1 = std::operator<<((ostream *)local_1a8,"\tgl_Position = gl_in[0].gl_Position + position")
    ;
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)((long)this + 0x74) + iVar2);
    std::operator<<(poVar1,
                    ";\n\tgl_PrimitiveID = gl_PrimitiveIDIn;\n\tv_frag_FragColor = v_geom_FragColor[0];\n\tEmitVertex();\n\n"
                   );
  }
  for (iVar2 = 0; iVar2 < *(int *)((long)this + 0x80); iVar2 = iVar2 + 1) {
    std::operator<<((ostream *)local_1a8,"\tEndPrimitive();\n");
  }
  std::operator<<((ostream *)local_1a8,"}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

string EmitTest::shaderGeometry (bool pointSize) const
{
	std::ostringstream src;
	src	<< "#version 310 es\n"
		<< "#extension GL_EXT_geometry_shader : require\n";
	if (pointSize)
		src	<<"#extension GL_EXT_geometry_point_size : require\n";
	src	<< "layout(points) in;\n"
		<< "layout(" << outputTypeToGLString(m_emitTestSpec.primitiveTopology) << ", max_vertices = " << (m_emitTestSpec.emitCountA + m_emitTestSpec.emitCountB +1) << ") out;\n"
		<< "layout(location = 0) in highp vec4 v_geom_FragColor[];\n"
		<< "layout(location = 0) out highp vec4 v_frag_FragColor;\n"
		<< "void main (void)\n"
		<< "{\n"
		<< "	const highp vec4 position0 = vec4(-0.5,  0.5, 0.0, 0.0);\n"
		<< "	const highp vec4 position1 = vec4( 0.0,  0.1, 0.0, 0.0);\n"
		<< "	const highp vec4 position2 = vec4( 0.5,  0.5, 0.0, 0.0);\n"
		<< "	const highp vec4 position3 = vec4( 0.7, -0.2, 0.0, 0.0);\n"
		<< "	const highp vec4 position4 = vec4( 0.2,  0.2, 0.0, 0.0);\n"
		<< "	const highp vec4 position5 = vec4( 0.4, -0.3, 0.0, 0.0);\n";
	for (int i = 0; i < m_emitTestSpec.emitCountA; ++i)
	{
		if (pointSize)
			src	<< "	gl_PointSize = 1.0;\n";
		src <<	"	gl_Position = gl_in[0].gl_Position + position" << i << ";\n"
				"	gl_PrimitiveID = gl_PrimitiveIDIn;\n"
				"	v_frag_FragColor = v_geom_FragColor[0];\n"
				"	EmitVertex();\n"
				"\n";
	}

	for (int i = 0; i < m_emitTestSpec.endCountA; ++i)
		src << "	EndPrimitive();\n";

	for (int i = 0; i < m_emitTestSpec.emitCountB; ++i)
	{
		if (pointSize)
			src	<< "	gl_PointSize = 1.0;\n";
		src <<	"	gl_Position = gl_in[0].gl_Position + position" << (m_emitTestSpec.emitCountA + i) << ";\n"
				"	gl_PrimitiveID = gl_PrimitiveIDIn;\n"
				"	v_frag_FragColor = v_geom_FragColor[0];\n"
				"	EmitVertex();\n"
				"\n";
	}

	for (int i = 0; i < m_emitTestSpec.endCountB; ++i)
		src << "	EndPrimitive();\n";
	src	<< "}\n";
	return src.str();
}